

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal
          (ChElementBeamTaperedTimoshenko *this,bool inertial_damping,bool inertial_stiffness)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pointer psVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  element_type *peVar17;
  double *pdVar18;
  element_type *peVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChVector<double> mXacc_B;
  ChVector<double> mXacc_A;
  ChVector<double> mW_B;
  ChVector<double> mW_A;
  ChVector<double> mWvel_B;
  ChVector<double> mWacc_B;
  ChMatrixNM<double,_12,_12> mH;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined1 local_560 [24];
  undefined1 local_548 [24];
  undefined1 local_530 [24];
  undefined1 local_518 [24];
  undefined1 local_500 [64];
  undefined1 auStack_4c0 [1176];
  
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x2ef,
                  "void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal(bool, bool)"
                 );
  }
  if (inertial_damping) {
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var16 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar15->super_ChNodeFEAbase).field_0x18);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var16 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar15->super_ChNodeFEAbase).field_0x18);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    peVar17 = (this->tapered_section).
              super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar17->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[3])
              (peVar17,local_500,local_548,local_560);
    dVar1 = (this->super_ChElementBeam).length;
    if (((this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows != 0xc) ||
       ((this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != 0xc)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)&this->Ri,0x90,0xc,0xc);
    }
    if (((this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows != 0xc) ||
       ((this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != 0xc)) goto LAB_006824b9;
    pdVar18 = (this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar1 * 0.5;
    auVar24 = vbroadcastsd_avx512f(auVar26);
    uVar23 = 0xfffffffffffffff8;
    do {
      auVar25 = vmulpd_avx512f(auVar24,*(undefined1 (*) [64])(auStack_4c0 + uVar23 * 8));
      *(undefined1 (*) [64])(pdVar18 + uVar23 + 8) = auVar25;
      uVar23 = uVar23 + 8;
    } while (uVar23 < 0x88);
  }
  else {
    iVar21 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    iVar22 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
              (&(this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (long)iVar21,(long)iVar22);
  }
  if (inertial_stiffness) {
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var16 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar15->super_ChNodeFEAbase).field_0x18);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var16 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWacc_loc
              ((ChFrameMoving<double> *)&(peVar15->super_ChNodeFEAbase).field_0x18);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var16 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar19 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var20 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
      }
    }
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)&peVar19->field_0xd8;
    dVar1 = *(double *)&peVar19->field_0xe0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)&peVar15->field_0x58;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar1 * *(double *)&peVar15->field_0x70;
    auVar26 = vfmadd231sd_fma(auVar32,auVar27,auVar2);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *(ulong *)&peVar19->field_0xe8;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)&peVar15->field_0x88;
    auVar26 = vfmadd231sd_fma(auVar26,auVar34,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)&peVar15->field_0x60;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar1 * *(double *)&peVar15->field_0x78;
    auVar2 = vfmadd231sd_fma(auVar36,auVar27,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)&peVar15->field_0x90;
    auVar2 = vfmadd231sd_fma(auVar2,auVar34,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)&peVar15->field_0x68;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar1 * *(double *)&peVar15->field_0x80;
    auVar3 = vfmadd231sd_fma(auVar30,auVar27,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)&peVar15->field_0x98;
    auVar3 = vfmadd231sd_fma(auVar3,auVar34,auVar7);
    local_578 = auVar26._0_8_;
    local_570 = auVar2._0_8_;
    local_568 = auVar3._0_8_;
    if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
    }
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var16 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar15->super_ChNodeFEAbase).field_0x18);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var16 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWacc_loc
              ((ChFrameMoving<double> *)&(peVar15->super_ChNodeFEAbase).field_0x18);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar15 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var16 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    psVar14 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar19 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var20 = psVar14[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
      }
    }
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)&peVar19->field_0xd8;
    dVar1 = *(double *)&peVar19->field_0xe0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)&peVar15->field_0x58;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar1 * *(double *)&peVar15->field_0x70;
    auVar26 = vfmadd231sd_fma(auVar33,auVar28,auVar8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *(ulong *)&peVar19->field_0xe8;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)&peVar15->field_0x88;
    auVar26 = vfmadd231sd_fma(auVar26,auVar35,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)&peVar15->field_0x60;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar1 * *(double *)&peVar15->field_0x78;
    auVar2 = vfmadd231sd_fma(auVar37,auVar28,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)&peVar15->field_0x90;
    auVar2 = vfmadd231sd_fma(auVar2,auVar35,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)&peVar15->field_0x68;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar1 * *(double *)&peVar15->field_0x80;
    auVar3 = vfmadd231sd_fma(auVar31,auVar28,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)&peVar15->field_0x98;
    auVar3 = vfmadd231sd_fma(auVar3,auVar35,auVar13);
    local_590 = auVar26._0_8_;
    local_588 = auVar2._0_8_;
    local_580 = auVar3._0_8_;
    if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
    }
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    peVar17 = (this->tapered_section).
              super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar17->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[4])
              (peVar17,local_500,local_548,local_560,&local_578,local_530,local_518,&local_590);
    dVar1 = (this->super_ChElementBeam).length;
    if (((this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows != 0xc) ||
       ((this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != 0xc)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)&this->Ki,0x90,0xc,0xc);
    }
    if (((this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows != 0xc) ||
       ((this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != 0xc)) {
LAB_006824b9:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 12, 12, 1>>, const Eigen::Matrix<double, 12, 12, 1>>, T1 = double, T2 = double]"
                   );
    }
    pdVar18 = (this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar1 * 0.5;
    auVar24 = vbroadcastsd_avx512f(auVar29);
    uVar23 = 0xfffffffffffffff8;
    do {
      auVar25 = vmulpd_avx512f(auVar24,*(undefined1 (*) [64])(auStack_4c0 + uVar23 * 8));
      *(undefined1 (*) [64])(pdVar18 + uVar23 + 8) = auVar25;
      uVar23 = uVar23 + 8;
    } while (uVar23 < 0x88);
  }
  else {
    iVar21 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    iVar22 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
              (&(this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (long)iVar21,(long)iVar22);
  }
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal(bool inertial_damping, bool inertial_stiffness) {
    assert(tapered_section);

    if (inertial_damping) {
        ChVector<> mW_A = this->GetNodeA()->GetWvel_loc();
        ChVector<> mW_B = this->GetNodeB()->GetWvel_loc();
        ChMatrixNM<double, 12, 12> mH;
        this->tapered_section->ComputeInertiaDampingMatrix(mH, mW_A, mW_B);
        this->Ri = 0.5 * this->length * mH;
    } else {
        this->Ri.setZero(this->GetNdofs(), this->GetNdofs());
    }

    if (inertial_stiffness) {
        // current angular velocity of section of node A, in material frame
        ChVector<> mWvel_A = this->GetNodeA()->GetWvel_loc();
        // current angular acceleration of section of node A, in material frame
        ChVector<> mWacc_A = this->GetNodeA()->GetWacc_loc();
        // current acceleration of section of node A, in material frame)
        ChVector<> mXacc_A = this->GetNodeA()->TransformDirectionParentToLocal(this->GetNodeA()->GetPos_dtdt());
        // current angular velocity of section of node B, in material frame
        ChVector<> mWvel_B = this->GetNodeB()->GetWvel_loc();
        // current angular acceleration of section of node B, in material frame
        ChVector<> mWacc_B = this->GetNodeB()->GetWacc_loc();
        // current acceleration of section of node B, in material frame
        ChVector<> mXacc_B = this->GetNodeB()->TransformDirectionParentToLocal(this->GetNodeB()->GetPos_dtdt());

        ChMatrixNM<double, 12, 12> mH;
        this->tapered_section->ComputeInertiaStiffnessMatrix(mH, mWvel_A, mWacc_A, mXacc_A, mWvel_B, mWacc_B, mXacc_B);
        this->Ki = 0.5 * this->length * mH;
    } else {
        this->Ki.setZero(this->GetNdofs(), this->GetNdofs());
    }
}